

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O0

bool ft::lexicographical_compare<ft::constListIterator<int>,ft::constListIterator<int>>
               (constListIterator<int> *first1,constListIterator<int> *last1,
               constListIterator<int> *first2,constListIterator<int> *last2,type *param_5,
               type *param_6)

{
  bool bVar1;
  constListIterator<int> local_88;
  constListIterator<int> local_78 [2];
  constListIterator<int> local_58;
  constListIterator<int> local_48;
  type *local_38;
  type *param_5_local;
  type *param_4_local;
  constListIterator<int> *last2_local;
  constListIterator<int> *first2_local;
  constListIterator<int> *last1_local;
  constListIterator<int> *first1_local;
  
  local_38 = param_6;
  param_5_local = param_5;
  param_4_local = last2;
  last2_local = first2;
  first2_local = last1;
  last1_local = first1;
  constListIterator<int>::constListIterator(&local_48,first1);
  constListIterator<int>::constListIterator(&local_58,last1);
  constListIterator<int>::constListIterator(local_78,first2);
  constListIterator<int>::constListIterator(&local_88,last2);
  bVar1 = lexicographical_compare<ft::constListIterator<int>,ft::constListIterator<int>,ft::less<int>>
                    (&local_48,&local_58,local_78,&local_88,0);
  constListIterator<int>::~constListIterator(&local_88);
  constListIterator<int>::~constListIterator(local_78);
  constListIterator<int>::~constListIterator(&local_58);
  constListIterator<int>::~constListIterator(&local_48);
  return bVar1;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	return ft::lexicographical_compare(first1, last1, first2, last2, ft::less<typename ft::iterator_traits<Iterator1>::value_type>());
}